

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O3

int cgltf_parse_json_scenes
              (cgltf_options *options,jsmntok_t *tokens,int i,uint8_t *json_chunk,
              cgltf_data *out_data)

{
  int iVar1;
  cgltf_size cVar2;
  uint i_00;
  int iVar3;
  ulong uVar4;
  cgltf_scene *out_string;
  cgltf_size *out_array;
  jsmntok_t *pjVar5;
  cgltf_size cVar6;
  cgltf_size *in_stack_ffffffffffffff68;
  int local_8c;
  ulong local_88;
  
  out_array = &out_data->scenes_count;
  i_00 = cgltf_parse_json_array
                   (options,tokens,i,(uint8_t *)0x38,(size_t)&out_data->scenes,(void **)out_array,
                    in_stack_ffffffffffffff68);
  if ((-1 < (int)i_00) && (uVar4 = *out_array, uVar4 != 0)) {
    local_88 = 0;
    while (tokens[i_00].type == JSMN_OBJECT) {
      iVar1 = tokens[i_00].size;
      i_00 = i_00 + 1;
      if (0 < iVar1) {
        out_string = out_data->scenes + local_88;
        local_8c = 0;
        do {
          if ((tokens[i_00].type != JSMN_STRING) || (pjVar5 = tokens + i_00, pjVar5->size == 0))
          goto LAB_001120ca;
          iVar3 = cgltf_json_strcmp(pjVar5,json_chunk,"name");
          if (iVar3 == 0) {
            i_00 = cgltf_parse_json_string(options,tokens,i_00 + 1,json_chunk,&out_string->name);
LAB_0011208d:
            if ((int)i_00 < 0) {
              return i_00;
            }
          }
          else {
            iVar3 = cgltf_json_strcmp(pjVar5,json_chunk,"nodes");
            if (iVar3 != 0) {
              iVar3 = cgltf_json_strcmp(pjVar5,json_chunk,"extras");
              if (iVar3 == 0) {
                (out_string->extras).start_offset = (long)tokens[i_00 + 1].start;
                (out_string->extras).end_offset = (long)tokens[i_00 + 1].end;
              }
              else {
                iVar3 = cgltf_json_strcmp(pjVar5,json_chunk,"extensions");
                if (iVar3 == 0) {
                  i_00 = cgltf_parse_json_unprocessed_extensions
                                   (options,tokens,i_00,json_chunk,&out_string->extensions_count,
                                    &out_string->extensions);
                  goto LAB_0011208d;
                }
              }
              i_00 = cgltf_skip_json(tokens,i_00 + 1);
              goto LAB_0011208d;
            }
            i_00 = cgltf_parse_json_array
                             (options,tokens,i_00 + 1,(uint8_t *)0x8,(size_t)&out_string->nodes,
                              (void **)&out_string->nodes_count,in_stack_ffffffffffffff68);
            if ((int)i_00 < 0) {
              return i_00;
            }
            cVar2 = out_string->nodes_count;
            if (cVar2 != 0) {
              pjVar5 = tokens + i_00;
              cVar6 = 0;
              do {
                iVar3 = cgltf_json_to_int(pjVar5,json_chunk);
                out_string->nodes[cVar6] = (cgltf_node *)((long)iVar3 + 1);
                cVar6 = cVar6 + 1;
                pjVar5 = pjVar5 + 1;
              } while (cVar2 != cVar6);
              i_00 = i_00 + (int)cVar6;
              goto LAB_0011208d;
            }
          }
          local_8c = local_8c + 1;
        } while (local_8c != iVar1);
        uVar4 = *out_array;
      }
      local_88 = local_88 + 1;
      if (uVar4 <= local_88) {
        return i_00;
      }
    }
LAB_001120ca:
    i_00 = 0xffffffff;
  }
  return i_00;
}

Assistant:

static int cgltf_parse_json_scenes(cgltf_options* options, jsmntok_t const* tokens, int i, const uint8_t* json_chunk, cgltf_data* out_data)
{
	i = cgltf_parse_json_array(options, tokens, i, json_chunk, sizeof(cgltf_scene), (void**)&out_data->scenes, &out_data->scenes_count);
	if (i < 0)
	{
		return i;
	}

	for (cgltf_size j = 0; j < out_data->scenes_count; ++j)
	{
		i = cgltf_parse_json_scene(options, tokens, i, json_chunk, &out_data->scenes[j]);
		if (i < 0)
		{
			return i;
		}
	}
	return i;
}